

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O0

void __thiscall solution::clear(solution *this)

{
  bool bVar1;
  reference pbVar2;
  deque<step,_std::allocator<step>_> *in_RDI;
  bucket *b;
  iterator __end1;
  iterator __begin1;
  vector<bucket,_std::allocator<bucket>_> *__range1;
  vector<bucket,_std::allocator<bucket>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<bucket_*,_std::vector<bucket,_std::allocator<bucket>_>_> local_18;
  deque<step,_std::allocator<step>_> *this_00;
  
  this_00 = in_RDI;
  local_18._M_current =
       (bucket *)std::vector<bucket,_std::allocator<bucket>_>::begin(in_stack_ffffffffffffffc8);
  std::vector<bucket,_std::allocator<bucket>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<bucket_*,_std::vector<bucket,_std::allocator<bucket>_>_> *
                       )in_RDI,(__normal_iterator<bucket_*,_std::vector<bucket,_std::allocator<bucket>_>_>
                                *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::__normal_iterator<bucket_*,_std::vector<bucket,_std::allocator<bucket>_>_>::
             operator*(&local_18);
    pbVar2->used = 0;
    __gnu_cxx::__normal_iterator<bucket_*,_std::vector<bucket,_std::allocator<bucket>_>_>::
    operator++(&local_18);
  }
  std::deque<step,_std::allocator<step>_>::clear(this_00);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  in_RDI[3].super__Deque_base<step,_std::allocator<step>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  *(undefined4 *)
   &in_RDI[3].super__Deque_base<step,_std::allocator<step>_>._M_impl.super__Deque_impl_data._M_start
    ._M_last = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Deque_base<step,_std::allocator<step>_>._M_impl.super__Deque_impl_data.
           _M_start._M_last + 4) = 0;
  return;
}

Assistant:

void solution::clear()
{
	for (bucket& b : buckets)
		b.used = 0;
	current_steps.clear();
	steps_ixes.clear();
	not_found_reason = nullptr;
	measure = 0;
	wastage = 0;
}